

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O1

void __thiscall
BoundaryElement::cluster_particle_interact
          (BoundaryElement *this,double *potential,size_t target_node_idx,
          array<unsigned_long,_2UL> source_node_element_idxs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  Timers_BoundaryElement *pTVar9;
  InterpolationPoints *pIVar10;
  Elements *pEVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  pointer pdVar15;
  pointer pdVar16;
  pointer pdVar17;
  pointer pdVar18;
  pointer pdVar19;
  pointer pdVar20;
  pointer pdVar21;
  pointer pdVar22;
  pointer pdVar23;
  pointer pdVar24;
  pointer pdVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  rep rVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  long local_210;
  double dStack_50;
  
  uVar36 = source_node_element_idxs._M_elems[0];
  pTVar9 = this->timers_;
  rVar34 = std::chrono::_V2::steady_clock::now();
  (pTVar9->cluster_particle_interact).start_time_.__d.__r = rVar34;
  pIVar10 = this->interp_pts_;
  iVar7 = pIVar10->num_interp_pts_per_node_;
  lVar38 = (long)iVar7;
  if (0 < lVar38) {
    pEVar11 = this->elements_;
    iVar8 = this->num_charges_per_node_;
    dVar1 = this->params_->phys_eps_;
    dVar2 = this->params_->phys_kappa_;
    pdVar12 = (this->interp_potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13 = (this->interp_potential_dx_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar14 = (this->interp_potential_dy_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (pEVar11->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar16 = (pEVar11->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar17 = (pEVar11->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar18 = (pEVar11->source_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar19 = (pEVar11->source_charge_dx_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar20 = (pEVar11->source_charge_dy_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar21 = (pEVar11->source_charge_dz_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar40 = target_node_idx * lVar38;
    pdVar22 = (pIVar10->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar23 = (pIVar10->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar24 = (pIVar10->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar25 = (this->interp_potential_dz_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar37 = 0;
    do {
      lVar35 = 0;
      do {
        local_210 = 0;
        do {
          dVar41 = 0.0;
          dVar47 = 0.0;
          dVar33 = 0.0;
          dStack_50 = 0.0;
          if (uVar36 < source_node_element_idxs._M_elems[1]) {
            dVar3 = pdVar22[lVar40 + lVar37];
            dVar4 = pdVar23[lVar40 + lVar35];
            dVar5 = pdVar24[lVar40 + local_210];
            lVar39 = 0;
            dVar33 = 0.0;
            dStack_50 = 0.0;
            do {
              auVar29._8_4_ = SUB84(dStack_50,0);
              auVar29._0_8_ = dVar33;
              auVar29._12_4_ = (int)((ulong)dStack_50 >> 0x20);
              dVar26 = dVar4 - pdVar16[uVar36 + lVar39];
              dVar42 = dVar5 - pdVar17[uVar36 + lVar39];
              dVar30 = dVar3 - pdVar15[uVar36 + lVar39];
              dVar48 = dVar30 * dVar30 + dVar26 * dVar26 + dVar42 * dVar42;
              if (dVar48 < 0.0) {
                dVar31 = sqrt(dVar48);
              }
              else {
                dVar31 = SQRT(dVar48);
              }
              dVar27 = 1.0 / dVar31;
              dVar43 = dVar27 * dVar27 * dVar27;
              dVar28 = exp(dVar31 * -dVar2);
              dVar49 = dVar2 * dVar31 + 1.0;
              dVar44 = dVar28 * dVar43 * dVar49;
              dVar45 = dVar44 / dVar1 - dVar43;
              dVar53 = ((dVar48 * dVar2 * dVar2 + dVar31 * dVar2 * 3.0 + 3.0) * dVar28 + -3.0) *
                       dVar27 * dVar43 * dVar27;
              dVar32 = (1.0 - dVar49 * dVar28) * dVar43;
              dVar48 = pdVar19[uVar36 + lVar39];
              dVar31 = pdVar20[uVar36 + lVar39];
              dVar49 = pdVar21[uVar36 + lVar39];
              dVar52 = dVar30 * dVar26 * dVar53;
              dVar50 = dVar26 * dVar42 * dVar53;
              dVar51 = dVar30 * dVar42 * dVar53;
              dVar6 = pdVar18[uVar36 + lVar39];
              dVar46 = dVar45 * dVar6;
              dStack_50 = auVar29._8_8_;
              dVar33 = dVar33 + dVar6 * dVar45 * dVar30 +
                                -(dVar49 * dVar51 +
                                 (dVar30 * dVar30 * dVar53 + dVar32) * dVar48 + dVar31 * dVar52);
              dStack_50 = dStack_50 +
                          dVar6 * dVar27 * (1.0 - dVar28) +
                          (dVar49 * dVar42 + dVar48 * dVar30 + dVar26 * dVar31) *
                          (dVar44 * dVar1 - dVar43);
              dVar41 = dVar41 + (dVar46 * dVar42 -
                                ((dVar42 * dVar42 * dVar53 + dVar32) * dVar49 +
                                dVar51 * dVar48 + dVar50 * dVar31));
              dVar47 = dVar47 + (dVar26 * dVar46 -
                                (dVar49 * dVar50 +
                                dVar52 * dVar48 + (dVar26 * dVar26 * dVar53 + dVar32) * dVar31));
              lVar39 = lVar39 + 1;
            } while (source_node_element_idxs._M_elems[1] - uVar36 != lVar39);
          }
          lVar39 = lVar35 * lVar38 +
                   (long)(iVar7 * iVar7 * (int)lVar37) + (long)iVar8 * target_node_idx + local_210;
          pdVar12[lVar39] = dStack_50 + pdVar12[lVar39];
          pdVar13[lVar39] = dVar33 + pdVar13[lVar39];
          pdVar14[lVar39] = dVar47 + pdVar14[lVar39];
          pdVar25[lVar39] = dVar41 + pdVar25[lVar39];
          local_210 = local_210 + 1;
        } while (local_210 != lVar38);
        lVar35 = lVar35 + 1;
      } while (lVar35 != lVar38);
      lVar37 = lVar37 + 1;
    } while (lVar37 != lVar38);
  }
  pTVar9 = this->timers_;
  lVar38 = std::chrono::_V2::steady_clock::now();
  (pTVar9->cluster_particle_interact).end_time_.__d.__r = lVar38;
  (pTVar9->cluster_particle_interact).elapsed_time_.__r =
       (double)(lVar38 - (pTVar9->cluster_particle_interact).start_time_.__d.__r) / 1000000.0 +
       (pTVar9->cluster_particle_interact).elapsed_time_.__r;
  return;
}

Assistant:

void BoundaryElement::cluster_particle_interact(double* __restrict potential,
                                         std::size_t target_node_idx,
                                         std::array<std::size_t, 2> source_node_element_idxs)
{
    timers_.cluster_particle_interact.start();

    int num_interp_pts_per_node = interp_pts_.num_interp_pts_per_node();
    int num_potentials_per_node = num_charges_per_node_;
    
    std::size_t target_cluster_interp_pts_begin = target_node_idx * num_interp_pts_per_node;
    std::size_t target_cluster_potentials_begin = target_node_idx * num_potentials_per_node;

    std::size_t source_node_element_begin       = source_node_element_idxs[0];
    std::size_t source_node_element_end         = source_node_element_idxs[1];
    
    double eps    = params_.phys_eps_;
    double kappa  = params_.phys_kappa_;
    
    const double* __restrict clusters_x_ptr    = interp_pts_.interp_x_ptr();
    const double* __restrict clusters_y_ptr    = interp_pts_.interp_y_ptr();
    const double* __restrict clusters_z_ptr    = interp_pts_.interp_z_ptr();
    
    double* __restrict clusters_p_ptr          = interp_potential_.data();
    double* __restrict clusters_p_dx_ptr       = interp_potential_dx_.data();
    double* __restrict clusters_p_dy_ptr       = interp_potential_dy_.data();
    double* __restrict clusters_p_dz_ptr       = interp_potential_dz_.data();
    
    const double* __restrict elements_x_ptr    = elements_.x_ptr();
    const double* __restrict elements_y_ptr    = elements_.y_ptr();
    const double* __restrict elements_z_ptr    = elements_.z_ptr();
    
    const double* __restrict sources_q_ptr     = elements_.source_charge_ptr();
    const double* __restrict sources_q_dx_ptr  = elements_.source_charge_dx_ptr();
    const double* __restrict sources_q_dy_ptr  = elements_.source_charge_dy_ptr();
    const double* __restrict sources_q_dz_ptr  = elements_.source_charge_dz_ptr();
    
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop collapse(3) async(stream_id) present(clusters_x_ptr, clusters_y_ptr, clusters_z_ptr, \
                    clusters_p_ptr, clusters_p_dx_ptr, clusters_p_dy_ptr, clusters_p_dz_ptr, \
                    elements_x_ptr, elements_y_ptr, elements_z_ptr, \
                    sources_q_ptr, sources_q_dx_ptr, sources_q_dy_ptr, sources_q_dz_ptr, \
                    potential)
#endif
    for (int j1 = 0; j1 < num_interp_pts_per_node; ++j1) {
    for (int j2 = 0; j2 < num_interp_pts_per_node; ++j2) {
    for (int j3 = 0; j3 < num_interp_pts_per_node; ++j3) {
    
        std::size_t jj = target_cluster_potentials_begin
                       + j1 * num_interp_pts_per_node * num_interp_pts_per_node
                       + j2 * num_interp_pts_per_node + j3;

        double target_x = clusters_x_ptr[target_cluster_interp_pts_begin + j1];
        double target_y = clusters_y_ptr[target_cluster_interp_pts_begin + j2];
        double target_z = clusters_z_ptr[target_cluster_interp_pts_begin + j3];
        
        double pot_comp_   = 0.;
        double pot_comp_dx = 0.;
        double pot_comp_dy = 0.;
        double pot_comp_dz = 0.;
    
#ifdef OPENACC_ENABLED
        #pragma acc loop reduction(+:pot_comp_,   pot_comp_dx, \
                                     pot_comp_dy, pot_comp_dz)
#endif
        for (std::size_t k = source_node_element_begin; k < source_node_element_end; ++k) {

            double dx = target_x - elements_x_ptr[k];
            double dy = target_y - elements_y_ptr[k];
            double dz = target_z - elements_z_ptr[k];

            double r2    = dx*dx + dy*dy + dz*dz;
            double r     = std::sqrt(r2);
            double rinv  = 1. / r;
            double r3inv = rinv  * rinv * rinv;
            double r5inv = r3inv * rinv * rinv;

            double expkr   =  std::exp(-kappa * r);
            double d1term  =  r3inv * expkr * (1. + (kappa * r));
            double d1term1 = -r3inv + d1term * eps;
            double d1term2 = -r3inv + d1term / eps;
            double d2term  =  r5inv * (-3. + expkr * (3. + (3. * kappa * r)
                                                   + (kappa * kappa * r2)));
            double d3term  =  r3inv * ( 1. - expkr * (1. + kappa * r));

            pot_comp_    += (rinv * (1. - expkr) * (sources_q_ptr   [k])
                                      + d1term1 * (sources_q_dx_ptr[k] * dx
                                                 + sources_q_dy_ptr[k] * dy
                                                 + sources_q_dz_ptr[k] * dz));
                                    
            pot_comp_dx  += (sources_q_ptr   [k]  * (d1term2 * dx)
                          - (sources_q_dx_ptr[k]  * (dx * dx * d2term + d3term)
                          +  sources_q_dy_ptr[k]  * (dx * dy * d2term)
                          +  sources_q_dz_ptr[k]  * (dx * dz * d2term)));
                         
            pot_comp_dy  += (sources_q_ptr   [k]  *  d1term2 * dy
                          - (sources_q_dx_ptr[k]  * (dx * dy * d2term)
                          +  sources_q_dy_ptr[k]  * (dy * dy * d2term + d3term)
                          +  sources_q_dz_ptr[k]  * (dy * dz * d2term)));
                         
            pot_comp_dz  += (sources_q_ptr   [k]  *  d1term2 * dz
                          - (sources_q_dx_ptr[k]  * (dx * dz * d2term)
                          +  sources_q_dy_ptr[k]  * (dy * dz * d2term)
                          +  sources_q_dz_ptr[k]  * (dz * dz * d2term + d3term)));
        }
    
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_ptr   [jj] += pot_comp_;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_dx_ptr[jj] += pot_comp_dx;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_dy_ptr[jj] += pot_comp_dy;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_dz_ptr[jj] += pot_comp_dz;
    }
    }
    }

    timers_.cluster_particle_interact.stop();
}